

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<std::forward_list<long_double,std::allocator<long_double>>,void>
               (forward_list<long_double,_std::allocator<long_double>_> *container,ostream *os)

{
  bool bVar1;
  long lVar2;
  char local_35 [5];
  
  local_35[2] = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 2,1);
  lVar2 = 0;
  do {
    container = (forward_list<long_double,_std::allocator<long_double>_> *)
                ((_Fwd_list_node_base *)container)->_M_next;
    if ((_Fwd_list_impl)container == (_Fwd_list_impl)0x0) break;
    if (lVar2 == 0) {
LAB_001d8efd:
      local_35[1] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 1,1);
      std::ostream::_M_insert<long_double>(*(longdouble *)((long)container + 0x10));
      lVar2 = lVar2 + 1;
      bVar1 = true;
    }
    else {
      local_35[0] = ',';
      std::__ostream_insert<char,std::char_traits<char>>(os,local_35,1);
      if (lVar2 != 0x20) goto LAB_001d8efd;
      std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
      lVar2 = 0x20;
      bVar1 = false;
    }
  } while (bVar1);
  if (lVar2 != 0) {
    local_35[3] = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 3,1);
  }
  local_35[4] = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 4,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }